

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void cmDependsFortranParser_RuleModule(cmDependsFortranParser *parser,char *name)

{
  cmDependsFortranSourceInfo *pcVar1;
  allocator local_59;
  string local_58;
  string local_38;
  char *local_18;
  char *name_local;
  cmDependsFortranParser *parser_local;
  
  if ((parser->InPPFalseBranch == 0) && ((parser->InInterface & 1U) == 0)) {
    pcVar1 = parser->Info;
    local_18 = name;
    name_local = (char *)parser;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,name,&local_59);
    cmsys::SystemTools::LowerCase(&local_38,&local_58);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&pcVar1->Provides,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void cmDependsFortranParser_RuleModule(cmDependsFortranParser* parser,
                                       const char* name)
{
  if(!parser->InPPFalseBranch && !parser->InInterface)
    {
    parser->Info.Provides.insert(cmSystemTools::LowerCase(name));
    }
}